

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape_string.cpp
# Opt level: O2

string * __thiscall
libtorrent::base32encode_i2p_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,span<const_char> s)

{
  libtorrent *__last;
  uint uVar1;
  int iVar2;
  ulong uVar3;
  libtorrent *__first;
  array<std::uint8_t,_5> inbuf;
  array<std::uint8_t,_8> outbuf;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __first = this;
  while (__first != (libtorrent *)(s.m_ptr + (long)this)) {
    iVar2 = (int)(libtorrent *)(s.m_ptr + (long)this) - (int)__first;
    if (4 < iVar2) {
      iVar2 = 5;
    }
    inbuf.super_array<unsigned_char,_5UL>._M_elems[0] = '\0';
    inbuf.super_array<unsigned_char,_5UL>._M_elems[1] = '\0';
    inbuf.super_array<unsigned_char,_5UL>._M_elems[2] = '\0';
    inbuf.super_array<unsigned_char,_5UL>._M_elems[3] = '\0';
    inbuf.super_array<unsigned_char,_5UL>._M_elems[4] = '\0';
    __last = __first + iVar2;
    ::std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<char_const*,unsigned_char*>((char *)__first,(char *)__last,(uchar *)&inbuf);
    uVar1 = base32encode_i2p::input_output_mapping.super_array<int,_6UL>._M_elems[iVar2];
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar3 = 0; __first = __last, uVar1 != uVar3; uVar3 = uVar3 + 1) {
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string base32encode_i2p(span<char const> s)
	{
		static aux::array<char, 32> const base32_table{
		{
			'a', 'b', 'c', 'd', 'e', 'f', 'g', 'h',
			'i', 'j', 'k', 'l', 'm', 'n', 'o', 'p',
			'q', 'r', 's', 't', 'u', 'v', 'w', 'x',
			'y', 'z', '2', '3', '4', '5', '6', '7'
		}};

		static aux::array<int, 6> const input_output_mapping{{{0, 2, 4, 5, 7, 8}}};

		aux::array<std::uint8_t, 5> inbuf;
		aux::array<std::uint8_t, 8> outbuf;

		std::string ret;
		for (auto i = s.begin(); i != s.end();)
		{
			int const available_input = std::min(int(inbuf.size()), int(s.end() - i));

			// clear input buffer
			inbuf.fill(0);

			// read a chunk of input into inbuf
			std::copy(i, i + available_input, inbuf.begin());
			i += available_input;

			// encode inbuf to outbuf
			outbuf[0] = (inbuf[0] & 0xf8) >> 3;
			outbuf[1] = (((inbuf[0] & 0x07) << 2) | ((inbuf[1] & 0xc0) >> 6)) & 0xff;
			outbuf[2] = ((inbuf[1] & 0x3e) >> 1);
			outbuf[3] = (((inbuf[1] & 0x01) << 4) | ((inbuf[2] & 0xf0) >> 4)) & 0xff;
			outbuf[4] = (((inbuf[2] & 0x0f) << 1) | ((inbuf[3] & 0x80) >> 7)) & 0xff;
			outbuf[5] = ((inbuf[3] & 0x7c) >> 2);
			outbuf[6] = (((inbuf[3] & 0x03) << 3) | ((inbuf[4] & 0xe0) >> 5)) & 0xff;
			outbuf[7] = inbuf[4] & 0x1f;

			// write output
			int const num_out = input_output_mapping[available_input];
			for (int j = 0; j < num_out; ++j)
				ret += base32_table[outbuf[j]];
			// i2p does not use padding
		}
		return ret;
	}